

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecdh.c
# Opt level: O0

int ecdh_calc_secret_internal
              (mbedtls_ecdh_context_mbed *ctx,size_t *olen,uchar *buf,size_t blen,
              _func_int_void_ptr_uchar_ptr_size_t *f_rng,void *p_rng,int restart_enabled)

{
  mbedtls_ecp_curve_type mVar1;
  size_t sVar2;
  int ret;
  void *p_rng_local;
  _func_int_void_ptr_uchar_ptr_size_t *f_rng_local;
  size_t blen_local;
  uchar *buf_local;
  size_t *olen_local;
  mbedtls_ecdh_context_mbed *ctx_local;
  
  if ((ctx == (mbedtls_ecdh_context_mbed *)0x0) || ((ctx->grp).pbits == 0)) {
    ctx_local._4_4_ = -0x4f80;
  }
  else {
    ctx_local._4_4_ = mbedtls_ecdh_compute_shared(&ctx->grp,&ctx->z,&ctx->Qp,&ctx->d,f_rng,p_rng);
    if (ctx_local._4_4_ == 0) {
      sVar2 = mbedtls_mpi_size(&ctx->z);
      if (blen < sVar2) {
        ctx_local._4_4_ = -0x4f80;
      }
      else {
        *olen = ((ctx->grp).pbits >> 3) + (long)(int)(uint)(((ctx->grp).pbits & 7) != 0);
        mVar1 = mbedtls_ecp_get_type(&ctx->grp);
        if (mVar1 == MBEDTLS_ECP_TYPE_MONTGOMERY) {
          ctx_local._4_4_ = mbedtls_mpi_write_binary_le(&ctx->z,buf,*olen);
        }
        else {
          ctx_local._4_4_ = mbedtls_mpi_write_binary(&ctx->z,buf,*olen);
        }
      }
    }
  }
  return ctx_local._4_4_;
}

Assistant:

static int ecdh_calc_secret_internal( mbedtls_ecdh_context_mbed *ctx,
                                      size_t *olen, unsigned char *buf,
                                      size_t blen,
                                      int (*f_rng)(void *,
                                                   unsigned char *,
                                                   size_t),
                                      void *p_rng,
                                      int restart_enabled )
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
#if defined(MBEDTLS_ECP_RESTARTABLE)
    mbedtls_ecp_restart_ctx *rs_ctx = NULL;
#endif

    if( ctx == NULL || ctx->grp.pbits == 0 )
        return( MBEDTLS_ERR_ECP_BAD_INPUT_DATA );

#if defined(MBEDTLS_ECP_RESTARTABLE)
    if( restart_enabled )
        rs_ctx = &ctx->rs;
#else
    (void) restart_enabled;
#endif

#if defined(MBEDTLS_ECP_RESTARTABLE)
    if( ( ret = ecdh_compute_shared_restartable( &ctx->grp, &ctx->z, &ctx->Qp,
                                                 &ctx->d, f_rng, p_rng,
                                                 rs_ctx ) ) != 0 )
    {
        return( ret );
    }
#else
    if( ( ret = mbedtls_ecdh_compute_shared( &ctx->grp, &ctx->z, &ctx->Qp,
                                             &ctx->d, f_rng, p_rng ) ) != 0 )
    {
        return( ret );
    }
#endif /* MBEDTLS_ECP_RESTARTABLE */

    if( mbedtls_mpi_size( &ctx->z ) > blen )
        return( MBEDTLS_ERR_ECP_BAD_INPUT_DATA );

    *olen = ctx->grp.pbits / 8 + ( ( ctx->grp.pbits % 8 ) != 0 );

    if( mbedtls_ecp_get_type( &ctx->grp ) == MBEDTLS_ECP_TYPE_MONTGOMERY )
        return mbedtls_mpi_write_binary_le( &ctx->z, buf, *olen );

    return mbedtls_mpi_write_binary( &ctx->z, buf, *olen );
}